

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Value __thiscall
Catch::Runner::acceptExpression
          (Runner *this,ExpressionResultBuilder *assertionResult,AssertionInfo *assertionInfo)

{
  Value VVar1;
  AssertionResult AStack_d8;
  
  std::__cxx11::string::_M_assign((string *)&this->m_lastAssertionInfo);
  std::__cxx11::string::_M_assign((string *)&(this->m_lastAssertionInfo).lineInfo);
  (this->m_lastAssertionInfo).lineInfo.line = (assertionInfo->lineInfo).line;
  std::__cxx11::string::_M_assign((string *)&(this->m_lastAssertionInfo).capturedExpression);
  (this->m_lastAssertionInfo).resultDisposition = assertionInfo->resultDisposition;
  ExpressionResultBuilder::buildResult(&AStack_d8,assertionResult,assertionInfo);
  VVar1 = actOnCurrentResult(this,&AStack_d8);
  AssertionResult::~AssertionResult(&AStack_d8);
  return VVar1;
}

Assistant:

virtual ResultAction::Value acceptExpression( const ExpressionResultBuilder& assertionResult, const AssertionInfo& assertionInfo ) {
            m_lastAssertionInfo = assertionInfo;
            return actOnCurrentResult( assertionResult.buildResult( assertionInfo ) );
        }